

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O3

Sfm_Ntk_t * Abc_NtkExtractMfs(Abc_Ntk_t *pNtk,int nFirstFixed)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  int iVar4;
  Vec_Ptr_t *vNodes;
  Vec_Wec_t *vFanins;
  Vec_Int_t *pVVar5;
  char *__s;
  Vec_Wrd_t *vTruths;
  word *pwVar6;
  word *__s_00;
  word wVar7;
  Vec_Ptr_t *pVVar8;
  int *piVar9;
  Sfm_Ntk_t *pSVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  size_t __n;
  long lVar18;
  long lVar19;
  undefined1 auVar20 [16];
  int nTotal;
  Vec_Str_t *pVStack_220e0;
  Vec_Int_t *pVStack_220d8;
  Vec_Wrd_t *pVStack_220d0;
  ulong uStack_220c8;
  word *pwStack_220c0;
  word *pTruths [16];
  word pCube [1024];
  word TruthStore [16] [1024];
  
  memset(TruthStore,0,0x20000);
  pTruths[0xe] = (word *)0x0;
  pTruths[0xf] = (word *)0x0;
  pTruths[0xc] = (word *)0x0;
  pTruths[0xd] = (word *)0x0;
  pTruths[10] = (word *)0x0;
  pTruths[0xb] = (word *)0x0;
  pTruths[8] = (word *)0x0;
  pTruths[9] = (word *)0x0;
  pTruths[6] = (word *)0x0;
  pTruths[7] = (word *)0x0;
  pTruths[4] = (word *)0x0;
  pTruths[5] = (word *)0x0;
  pTruths[2] = (word *)0x0;
  pTruths[3] = (word *)0x0;
  pTruths[0] = (word *)0x0;
  pTruths[1] = (word *)0x0;
  memset(pCube,0,0x2000);
  nTotal = 0;
  uStack_220c8 = (ulong)(uint)nFirstFixed;
  if (nFirstFixed == 0) {
    vNodes = Abc_NtkAssignIDs(pNtk);
  }
  else {
    vNodes = Abc_NtkAssignIDs2(pNtk);
  }
  __n = (long)pNtk->vCos->nSize + (long)vNodes->nSize + (long)pNtk->vCis->nSize;
  vFanins = (Vec_Wec_t *)malloc(0x10);
  iVar15 = (int)__n;
  iVar4 = 8;
  if (6 < iVar15 - 1U) {
    iVar4 = iVar15;
  }
  vFanins->nCap = iVar4;
  if (iVar4 == 0) {
    pVVar5 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar5 = (Vec_Int_t *)calloc((long)iVar4,0x10);
  }
  vFanins->pArray = pVVar5;
  vFanins->nSize = iVar15;
  pVStack_220e0 = (Vec_Str_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar15 - 1U) {
    iVar4 = iVar15;
  }
  pVStack_220e0->nCap = iVar4;
  if (iVar4 == 0) {
    __s = (char *)0x0;
  }
  else {
    __s = (char *)malloc((long)iVar4);
  }
  pVStack_220e0->pArray = __s;
  pVStack_220e0->nSize = iVar15;
  pwVar6 = (word *)0x0;
  memset(__s,0,__n);
  vTruths = (Vec_Wrd_t *)malloc(0x10);
  vTruths->nCap = iVar4;
  if (iVar4 != 0) {
    pwVar6 = (word *)malloc((long)iVar4 << 3);
  }
  vTruths->pArray = pwVar6;
  vTruths->nSize = iVar15;
  __s_00 = (word *)0x0;
  memset(pwVar6,0,__n * 8);
  pVStack_220d8 = Abc_NtkAssignStarts(pNtk,vNodes,&nTotal);
  iVar15 = nTotal;
  lVar18 = (long)nTotal;
  pVStack_220d0 = (Vec_Wrd_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar15 - 1U) {
    iVar4 = iVar15;
  }
  pVStack_220d0->nCap = iVar4;
  if (iVar4 != 0) {
    __s_00 = (word *)malloc((long)iVar4 << 3);
  }
  pVStack_220d0->pArray = __s_00;
  pVStack_220d0->nSize = iVar15;
  lVar14 = 0;
  pwStack_220c0 = __s_00;
  memset(__s_00,0,lVar18 << 3);
  Abc_NtkFillTruthStore(TruthStore);
  lVar18 = 0;
  lVar19 = 1;
  auVar20._8_4_ = (int)TruthStore;
  auVar20._0_8_ = TruthStore;
  auVar20._12_4_ = (int)((ulong)TruthStore >> 0x20);
  do {
    pTruths[lVar14] = TruthStore[lVar18];
    pTruths[lVar14 + 1] = (word *)(lVar19 * 0x2000 + auVar20._8_8_);
    lVar14 = lVar14 + 2;
    lVar18 = lVar18 + 2;
    lVar19 = lVar19 + 2;
  } while (lVar14 != 0x10);
  if (0 < vNodes->nSize) {
    lVar18 = 0;
    do {
      plVar3 = (long *)vNodes->pArray[lVar18];
      iVar4 = *(int *)((long)plVar3 + 0x1c);
      if (iVar4 < 7) {
        wVar7 = Abc_SopToTruth((char *)plVar3[7],iVar4);
        iVar4 = (int)plVar3[8];
        if (((long)iVar4 < 0) || (vTruths->nSize <= iVar4)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                        ,0x1cf,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
        }
        vTruths->pArray[iVar4] = wVar7;
        if (0xfffffffffffffffd < wVar7 - 1) goto LAB_002df74e;
LAB_002df668:
        lVar14 = (long)(int)plVar3[8];
        if ((lVar14 < 0) || (vFanins->nSize <= (int)plVar3[8])) goto LAB_002df8f3;
        pVVar5 = vFanins->pArray + lVar14;
        iVar4 = *(int *)((long)plVar3 + 0x1c);
        if (vFanins->pArray[lVar14].nCap < iVar4) {
          if (pVVar5->pArray == (int *)0x0) {
            piVar9 = (int *)malloc((long)iVar4 << 2);
          }
          else {
            piVar9 = (int *)realloc(pVVar5->pArray,(long)iVar4 << 2);
          }
          pVVar5->pArray = piVar9;
          if (piVar9 == (int *)0x0) goto LAB_002df96f;
          pVVar5->nCap = iVar4;
          iVar4 = *(int *)((long)plVar3 + 0x1c);
        }
        if (0 < iVar4) {
          lVar14 = 0;
          do {
            Vec_IntPush(pVVar5,*(int *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                                 (long)*(int *)(plVar3[4] + lVar14 * 4) * 8) + 0x40)
                       );
            lVar14 = lVar14 + 1;
          } while (lVar14 < *(int *)((long)plVar3 + 0x1c));
        }
      }
      else {
        iVar1 = iVar4 + -6;
        uVar17 = 1 << ((byte)iVar1 & 0x1f);
        iVar2 = (int)plVar3[8];
        if (((long)iVar2 < 0) || (pVStack_220d8->nSize <= iVar2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar2 = pVStack_220d8->pArray[iVar2];
        if (((long)iVar2 < 0) || (iVar15 <= iVar2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                        ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        pwVar6 = pwStack_220c0 + iVar2;
        Abc_SopToTruthBig((char *)plVar3[7],iVar4,pTruths,pCube,pwVar6);
        if (iVar1 == 0x1f) goto LAB_002df668;
        uVar16 = 1;
        if (1 < (int)uVar17) {
          uVar16 = (ulong)uVar17;
        }
        uVar11 = 0;
        do {
          uVar12 = uVar11;
          if (pwVar6[uVar11] != 0) break;
          uVar11 = uVar11 + 1;
          uVar12 = uVar16;
        } while (uVar16 != uVar11);
        if ((uint)uVar12 != uVar17) {
          if (iVar1 != 0x1f) {
            uVar13 = 1;
            if (1 < (int)uVar17) {
              uVar13 = uVar17;
            }
            uVar11 = 0;
            do {
              if (pwVar6[uVar11] != 0xffffffffffffffff) {
                uVar13 = (uint)uVar11;
                break;
              }
              uVar11 = uVar11 + 1;
            } while (uVar16 != uVar11);
            if (uVar13 == uVar17) goto LAB_002df74e;
          }
          goto LAB_002df668;
        }
      }
LAB_002df74e:
      lVar18 = lVar18 + 1;
    } while (lVar18 < vNodes->nSize);
  }
  pVVar8 = pNtk->vCos;
  if (0 < pVVar8->nSize) {
    lVar18 = 0;
    do {
      plVar3 = (long *)pVVar8->pArray[lVar18];
      lVar14 = (long)(int)plVar3[8];
      if ((lVar14 < 0) || (vFanins->nSize <= (int)plVar3[8])) {
LAB_002df8f3:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar5 = vFanins->pArray + lVar14;
      iVar15 = *(int *)((long)plVar3 + 0x1c);
      if (vFanins->pArray[lVar14].nCap < iVar15) {
        if (pVVar5->pArray == (int *)0x0) {
          piVar9 = (int *)malloc((long)iVar15 << 2);
        }
        else {
          piVar9 = (int *)realloc(pVVar5->pArray,(long)iVar15 << 2);
        }
        pVVar5->pArray = piVar9;
        if (piVar9 == (int *)0x0) {
LAB_002df96f:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        pVVar5->nCap = iVar15;
        iVar15 = *(int *)((long)plVar3 + 0x1c);
      }
      if (0 < iVar15) {
        lVar14 = 0;
        do {
          Vec_IntPush(pVVar5,*(int *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                               (long)*(int *)(plVar3[4] + lVar14 * 4) * 8) + 0x40));
          lVar14 = lVar14 + 1;
        } while (lVar14 < *(int *)((long)plVar3 + 0x1c));
      }
      lVar18 = lVar18 + 1;
      pVVar8 = pNtk->vCos;
    } while (lVar18 < pVVar8->nSize);
  }
  if (vNodes->pArray != (void **)0x0) {
    free(vNodes->pArray);
  }
  free(vNodes);
  uVar17 = pNtk->vCis->nSize;
  uVar16 = (ulong)uVar17;
  iVar15 = (int)uStack_220c8;
  uVar13 = uVar17;
  if (0 < iVar15) {
    do {
      if (((int)uVar17 < 0) || (pVStack_220e0->nSize <= (int)uVar16)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                      ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
      }
      pVStack_220e0->pArray[uVar16] = '\x01';
      uVar16 = uVar16 + 1;
      uVar13 = pNtk->vCis->nSize;
    } while ((int)uVar16 < (int)(uVar13 + iVar15));
  }
  if ((-1 < iVar15) && (iVar15 < pNtk->nObjCounts[7])) {
    pSVar10 = Sfm_NtkConstruct(vFanins,uVar13,pNtk->vCos->nSize,pVStack_220e0,(Vec_Str_t *)0x0,
                               vTruths,pVStack_220d8,pVStack_220d0);
    return pSVar10;
  }
  __assert_fail("nFirstFixed >= 0 && nFirstFixed < Abc_NtkNodeNum(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMfs.c"
                ,0xd2,"Sfm_Ntk_t *Abc_NtkExtractMfs(Abc_Ntk_t *, int)");
}

Assistant:

Sfm_Ntk_t * Abc_NtkExtractMfs( Abc_Ntk_t * pNtk, int nFirstFixed )
{
    word TruthStore[16][1<<10] = {{0}}, * pTruths[16] = {NULL}, pCube[1<<10] = {0};
    Vec_Ptr_t * vNodes;
    Vec_Wec_t * vFanins;
    Vec_Str_t * vFixed;
    Vec_Wrd_t * vTruths;
    Vec_Int_t * vArray;
    Vec_Int_t * vStarts;
    Vec_Wrd_t * vTruths2;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, nObjs, nTotal = 0;
    vNodes  = nFirstFixed ? Abc_NtkAssignIDs2(pNtk) : Abc_NtkAssignIDs(pNtk);
    nObjs   = Abc_NtkCiNum(pNtk) + Vec_PtrSize(vNodes) + Abc_NtkCoNum(pNtk);
    vFanins = Vec_WecStart( nObjs );
    vFixed  = Vec_StrStart( nObjs );
    vTruths = Vec_WrdStart( nObjs );
    vStarts = Abc_NtkAssignStarts( pNtk, vNodes, &nTotal );
    vTruths2= Vec_WrdStart( nTotal );
    Abc_NtkFillTruthStore( TruthStore );
    for ( i = 0; i < 16; i++ )
        pTruths[i] = TruthStore[i];
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        if ( Abc_ObjFaninNum(pObj) <= 6 )
        {
            word uTruth = Abc_SopToTruth((char *)pObj->pData, Abc_ObjFaninNum(pObj));
            Vec_WrdWriteEntry( vTruths, pObj->iTemp, uTruth );
            if ( uTruth == 0 || ~uTruth == 0 )
                continue;
        }
        else
        {
            int nWords  = Abc_Truth6WordNum( Abc_ObjFaninNum(pObj) );
            int Offset  = Vec_IntEntry( vStarts, pObj->iTemp );
            word * pRes = Vec_WrdEntryP( vTruths2, Offset );
            Abc_SopToTruthBig( (char *)pObj->pData, Abc_ObjFaninNum(pObj), pTruths, pCube, pRes );
            // check const0
            for ( k = 0; k < nWords; k++ )
                if ( pRes[k] )
                    break;
            if ( k == nWords )
                continue;
            // check const1
            for ( k = 0; k < nWords; k++ )
                if ( ~pRes[k] )
                    break;
            if ( k == nWords )
                continue;
        }
        vArray = Vec_WecEntry( vFanins, pObj->iTemp );
        Vec_IntGrow( vArray, Abc_ObjFaninNum(pObj) );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Vec_IntPush( vArray, pFanin->iTemp );
        //Vec_IntPrint( vArray );
    }
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        vArray = Vec_WecEntry( vFanins, pObj->iTemp );
        Vec_IntGrow( vArray, Abc_ObjFaninNum(pObj) );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Vec_IntPush( vArray, pFanin->iTemp );
    }
    Vec_PtrFree( vNodes );
    for ( i = Abc_NtkCiNum(pNtk); i < Abc_NtkCiNum(pNtk) + nFirstFixed; i++ )
        Vec_StrWriteEntry( vFixed, i, (char)1 );
    // update fixed
    assert( nFirstFixed >= 0 && nFirstFixed < Abc_NtkNodeNum(pNtk) );
//    for ( i = Abc_NtkCiNum(pNtk); i + Abc_NtkCoNum(pNtk) < Abc_NtkObjNum(pNtk); i++ )
//        if ( rand() % 10 == 0 )
//            Vec_StrWriteEntry( vFixed, i, (char)1 );
    return Sfm_NtkConstruct( vFanins, Abc_NtkCiNum(pNtk), Abc_NtkCoNum(pNtk), vFixed, NULL, vTruths, vStarts, vTruths2 );
}